

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall cbtGImpactMeshShape::setMargin(cbtGImpactMeshShape *this,cbtScalar margin)

{
  long lVar1;
  
  *(cbtScalar *)
   &(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.field_0x1c
       = margin;
  for (lVar1 = (long)(this->m_mesh_parts).m_size; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*((this->m_mesh_parts).m_data[lVar1 + -1]->super_cbtGImpactShapeInterface).
      super_cbtConcaveShape.super_cbtCollisionShape._vptr_cbtCollisionShape[0xb])
              ((ulong)(uint)margin);
  }
  (this->super_cbtGImpactShapeInterface).m_needs_update = true;
  return;
}

Assistant:

virtual void setMargin(cbtScalar margin)
	{
		m_collisionMargin = margin;

		int i = m_mesh_parts.size();
		while (i--)
		{
			cbtGImpactMeshShapePart* part = m_mesh_parts[i];
			part->setMargin(margin);
		}

		m_needs_update = true;
	}